

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_cfg.cpp
# Opt level: O0

bool __thiscall mocker::RemoveUnreachableBlocks::operator()(RemoveUnreachableBlocks *this)

{
  bool bVar1;
  pointer this_00;
  size_t sVar2;
  BasicBlockList *pBVar3;
  reference puVar4;
  BasicBlock *bb_00;
  size_type sVar5;
  size_type sVar6;
  list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *this_01;
  unsigned_long *succ;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  size_t local_c8;
  _Node_iterator_base<unsigned_long,_false> local_c0;
  reference local_b8;
  BasicBlock *bb;
  const_iterator __end1;
  const_iterator __begin1;
  BasicBlockList *__range1;
  anon_class_24_3_08b6a553 local_80;
  undefined1 local_68 [8];
  function<void_(unsigned_long)> visit;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  reachable;
  RemoveUnreachableBlocks *this_local;
  
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&visit._M_invoker);
  local_80.visit = (function<void_(unsigned_long)> *)local_68;
  local_80.reachable =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&visit._M_invoker;
  local_80.this = this;
  std::function<void(unsigned_long)>::operator()
            ((function<void(unsigned_long)> *)local_80.visit,&local_80);
  __range1 = (BasicBlockList *)ir::FunctionModule::getFirstBB((this->super_FuncPass).func);
  this_00 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                      ((_List_iterator<mocker::ir::BasicBlock> *)&__range1);
  sVar2 = ir::BasicBlock::getLabelID(this_00);
  std::function<void_(unsigned_long)>::operator()((function<void_(unsigned_long)> *)local_68,sVar2);
  pBVar3 = ir::FunctionModule::getBBs_abi_cxx11_((this->super_FuncPass).func);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(pBVar3);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (pBVar3);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&bb), bVar1) {
    local_b8 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    local_c8 = ir::BasicBlock::getLabelID(local_b8);
    local_c0._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::find((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&visit._M_invoker,&local_c8);
    __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&visit._M_invoker);
    bVar1 = std::__detail::operator!=
                      (&local_c0,(_Node_iterator_base<unsigned_long,_false> *)&__range2);
    if (!bVar1) {
      ir::BasicBlock::getSuccessors
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__begin2,local_b8);
      __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__begin2);
      succ = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__begin2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&succ), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end2);
        bb_00 = ir::FunctionModule::getMutableBasicBlock((this->super_FuncPass).func,*puVar4);
        sVar2 = ir::BasicBlock::getLabelID(local_b8);
        deletePhiOptionInBB(bb_00,sVar2);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end2);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__begin2);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  }
  pBVar3 = ir::FunctionModule::getBBs_abi_cxx11_((this->super_FuncPass).func);
  sVar5 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::size
                    (pBVar3);
  sVar6 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)&visit._M_invoker);
  this->cnt = sVar5 - sVar6;
  this_01 = (list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)
            ir::FunctionModule::getMutableBBs_abi_cxx11_((this->super_FuncPass).func);
  std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::operator()
            (this_01,(anon_class_8_1_d1fc03ed)&visit._M_invoker);
  sVar2 = this->cnt;
  std::function<void_(unsigned_long)>::~function((function<void_(unsigned_long)> *)local_68);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&visit._M_invoker);
  return sVar2 != 0;
}

Assistant:

bool RemoveUnreachableBlocks::operator()() {
  std::unordered_set<std::size_t> reachable;
  std::function<void(std::size_t cur)> visit = [&visit, &reachable,
                                                this](std::size_t cur) {
    if (reachable.find(cur) != reachable.end())
      return;
    reachable.emplace(cur);
    for (auto suc : func.getBasicBlock(cur).getSuccessors())
      visit(suc);
  };
  visit(func.getFirstBB()->getLabelID());

  for (auto &bb : func.getBBs()) {
    if (reachable.find(bb.getLabelID()) != reachable.end())
      continue;
    for (auto &succ : bb.getSuccessors()) {
      deletePhiOptionInBB(func.getMutableBasicBlock(succ), bb.getLabelID());
    }
  }

  cnt = func.getBBs().size() - reachable.size();
  func.getMutableBBs().remove_if([&reachable](const ir::BasicBlock &bb) {
    return reachable.find(bb.getLabelID()) == reachable.end();
  });
  return cnt != 0;
}